

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.cc
# Opt level: O2

void __thiscall VW::config::options_boost_po::check_unregistered(options_boost_po *this)

{
  _Rb_tree_node_base *__x;
  size_type sVar1;
  _Base_ptr p_Var2;
  ostream *poVar3;
  vw_unrecognised_option_exception *this_00;
  string sStack_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  p_Var2 = (this->m_supplied_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(this->m_supplied_options)._M_t._M_impl.super__Rb_tree_header)
    {
      return;
    }
    __x = p_Var2 + 1;
    sVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this->m_defined_options,(key_type *)__x);
    if (sVar1 == 0) {
      sVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->m_ignore_supplied,(key_type *)__x);
      if (sVar1 == 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        poVar3 = std::operator<<(&local_1a8,"unrecognised option \'--");
        poVar3 = std::operator<<(poVar3,(string *)__x);
        std::operator<<(poVar3,"\'");
        this_00 = (vw_unrecognised_option_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        vw_unrecognised_option_exception::vw_unrecognised_option_exception
                  (this_00,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/options_boost_po.cc"
                   ,0x98,&sStack_1d8);
        __cxa_throw(this_00,&vw_unrecognised_option_exception::typeinfo,vw_exception::~vw_exception)
        ;
      }
    }
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

void options_boost_po::check_unregistered()
{
  for (auto const& supplied : m_supplied_options)
  {
    if (m_defined_options.count(supplied) == 0 && m_ignore_supplied.count(supplied) == 0)
    {
      THROW_EX(VW::vw_unrecognised_option_exception, "unrecognised option '--" << supplied << "'");
    }
  }
}